

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::~InternalMetadata(InternalMetadata *this)

{
  ulong uVar1;
  ThreadSafeArena *this_00;
  
  uVar1 = this->ptr_;
  if ((uVar1 & 2) != 0) {
    this_00 = (ThreadSafeArena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      this_00 = *(ThreadSafeArena **)this_00;
    }
    if (this_00 != (ThreadSafeArena *)0x0) {
      ThreadSafeArena::~ThreadSafeArena(this_00);
      operator_delete(this_00,0x20);
      return;
    }
  }
  return;
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasMessageOwnedArenaTag() const {
    return ptr_ & kMessageOwnedArenaTagMask;
  }